

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFileAndLineForFailure(TestOutput *this,TestFailure *failure)

{
  SimpleString *testName;
  long *in_RSI;
  SimpleString *in_RDI;
  TestOutput *unaff_retaddr;
  TestOutput *in_stack_ffffffffffffffc0;
  undefined1 local_20 [16];
  
  (**(code **)(*in_RSI + 0x10))(local_20);
  testName = (SimpleString *)(**(code **)(*in_RSI + 0x28))();
  printErrorInFileOnLineFormattedForWorkingEnvironment(unaff_retaddr,in_RDI,(size_t)in_RSI);
  SimpleString::~SimpleString((SimpleString *)0x17d340);
  (**(code **)(*in_RSI + 0x18))();
  printFailureInTest(in_stack_ffffffffffffffc0,testName);
  SimpleString::~SimpleString((SimpleString *)0x17d371);
  return;
}

Assistant:

void TestOutput::printFileAndLineForFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
    printFailureInTest(failure.getTestName());
}